

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_chunk_count
          (exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,char *tname
          ,int32_t attrsz)

{
  int iVar1;
  exr_result_t eVar2;
  uint32_t uVar3;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  exr_result_t rv;
  exr_attribute_t **in_stack_00000040;
  int local_2c;
  char *local_28;
  long local_20;
  long local_18;
  long local_10;
  exr_result_t local_4;
  
  local_10 = in_RDI;
  if (*(long *)(in_RSI + 0x80) == 0) {
    local_2c = in_R8D;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = strcmp(in_RCX,"int");
    if (iVar1 == 0) {
      if (local_2c == 4) {
        iVar1 = (**(code **)(local_20 + 0x20))(local_20,&local_2c,4);
        if (iVar1 == 0) {
          eVar2 = exr_attr_list_add_static_name
                            (ctxt,(exr_attribute_list_t *)curpart,(char *)scratch,tname._4_4_,
                             (int32_t)tname,(uint8_t **)CONCAT44(attrsz,rv),in_stack_00000040);
          if (eVar2 == 0) {
            uVar3 = one_to_native32(0);
            *(uint32_t *)(*(long *)(local_18 + 0x80) + 0x18) = uVar3;
            *(uint32_t *)(local_18 + 0xf4) = uVar3;
            local_4 = 0;
          }
          else {
            local_4 = (**(code **)(local_10 + 0x48))
                                (local_10,eVar2,
                                 "Unable to initialize attribute \'%s\', type \'int\'","chunkCount")
            ;
          }
        }
        else {
          local_4 = (**(code **)(local_10 + 0x40))(local_10,iVar1,"Unable to read chunkCount data");
        }
      }
      else {
        (**(code **)(local_20 + 0x28))(local_20,local_2c);
        local_4 = (**(code **)(local_10 + 0x48))
                            (local_10,0xe,
                             "Required attribute \'chunkCount\': Invalid size %d (exp 4)",local_2c);
      }
    }
    else {
      (**(code **)(local_20 + 0x28))(local_20,local_2c);
      local_4 = (**(code **)(local_10 + 0x48))
                          (local_10,0x10,"attribute \'chunkCount\': Invalid type \'%s\'",local_28);
    }
  }
  else {
    (**(code **)(in_RDX + 0x28))(in_RDX,in_R8D);
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,0xe,
                         "Duplicate copy of required attribute \'chunkCount\' encountered");
  }
  return local_4;
}

Assistant:

static exr_result_t
check_populate_chunk_count (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;

    if (curpart->chunkCount)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Duplicate copy of required attribute 'chunkCount' encountered");
    }

    if (0 != strcmp (tname, "int"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "attribute 'chunkCount': Invalid type '%s'",
            tname);
    }

    if (attrsz != sizeof (int32_t))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Required attribute 'chunkCount': Invalid size %d (exp 4)",
            attrsz);
    }

    rv = scratch->sequential_read (scratch, &attrsz, sizeof (int32_t));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (ctxt, rv, "Unable to read chunkCount data");

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_CHUNK_COUNT_STR,
        EXR_ATTR_INT,
        0,
        NULL,
        &(curpart->chunkCount));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'int'",
            EXR_REQ_CHUNK_COUNT_STR);

    attrsz                 = (int32_t) one_to_native32 ((uint32_t) attrsz);
    curpart->chunkCount->i = attrsz;
    curpart->chunk_count   = attrsz;
    return rv;
}